

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

float ImGui::GetColumnOffset(int column_index)

{
  ImGuiColumns *pIVar1;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1 != (ImGuiColumns *)0x0) {
    if (column_index < 0) {
      column_index = pIVar1->Current;
    }
    return (pIVar1->OffMaxX - pIVar1->OffMinX) * (pIVar1->Columns).Data[column_index].OffsetNorm +
           pIVar1->OffMinX;
  }
  return 0.0;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }